

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * cmGeneratorExpression::Evaluate
                   (string *__return_storage_ptr__,string *input,cmLocalGenerator *lg,string *config
                   ,cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
                   cmGeneratorTarget *currentTarget,string *language)

{
  size_type sVar1;
  string *psVar2;
  string local_1d8;
  cmListFileBacktrace local_1b8;
  undefined1 local_1a0 [8];
  cmCompiledGeneratorExpression cge;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  string *input_local;
  
  cge.SourceSensitiveTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)dagChecker;
  sVar1 = Find(input);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_1b8);
    std::__cxx11::string::string((string *)&local_1d8,(string *)input);
    cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
              ((cmCompiledGeneratorExpression *)local_1a0,&local_1b8,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1b8);
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_1a0,lg,config,headTarget,
                        (cmGeneratorExpressionDAGChecker *)
                        cge.SourceSensitiveTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        currentTarget,language);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression
              ((cmCompiledGeneratorExpression *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Evaluate(
  std::string input, cmLocalGenerator* lg, const std::string& config,
  cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget const* currentTarget, std::string const& language)
{
  if (Find(input) != std::string::npos) {
    cmCompiledGeneratorExpression cge(cmListFileBacktrace(), std::move(input));
    return cge.Evaluate(lg, config, headTarget, dagChecker, currentTarget,
                        language);
  }
  return input;
}